

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  exception *ex;
  ifstream input;
  int local_1c;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    local_1c = (anonymous_namespace)::slurp<std::istream>
                         ((basic_istream<char,_std::char_traits<char>_> *)&std::cin);
  }
  else {
    std::ifstream::ifstream(&ex,argv[1],8);
    local_1c = (anonymous_namespace)::slurp<std::ifstream>
                         ((basic_ifstream<char,_std::char_traits<char>_> *)&ex);
    std::ifstream::~ifstream(&ex);
  }
  return local_1c;
}

Assistant:

int main (int argc, char const * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    PSTORE_TRY {
        if (argc < 2) {
            exit_code = slurp (std::cin);
        } else {
            std::ifstream input (argv[1]);
            exit_code = slurp (input);
        }
    }
    // clang-format off
    PSTORE_CATCH (std::exception const & ex, { // clang-format on
        error_stream << PSTORE_NATIVE_TEXT ("Error: ") << pstore::utf::to_native_string (ex.what ())
                     << PSTORE_NATIVE_TEXT ('\n');
        exit_code = EXIT_FAILURE;
    })
    // clang-format off
    PSTORE_CATCH (..., { // clang-format on
        error_stream << PSTORE_NATIVE_TEXT ("Unknown exception.\n");
        exit_code = EXIT_FAILURE;
    })
    return exit_code;
}